

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O0

monst * restmonchn(memfile *mf,level *lev,boolean ghostly)

{
  uint nid_00;
  monst *pmVar1;
  boolean bVar2;
  int mndx_00;
  monst *shkp;
  obj *poVar3;
  uint uVar4;
  uint nid;
  uint mndx;
  uint count;
  obj *obj;
  monst *first;
  monst *mtmp2;
  monst *mtmp;
  boolean ghostly_local;
  level *lev_local;
  memfile *mf_local;
  
  first = (monst *)0x0;
  obj = (obj *)0x0;
  mfmagic_check(mf,0x4e48434d);
  nid = mread32(mf);
  while (uVar4 = nid - 1, nid != 0) {
    shkp = restore_mon(mf);
    pmVar1 = shkp;
    if (obj != (obj *)0x0) {
      first->nmon = shkp;
      pmVar1 = (monst *)obj;
    }
    obj = (obj *)pmVar1;
    shkp->dlevel = lev;
    nid_00 = flags.ident;
    if (ghostly != '\0') {
      flags.ident = flags.ident + 1;
      add_id_mapping(shkp->m_id,nid_00);
      shkp->m_id = nid_00;
      mndx_00 = monsndx(shkp->data);
      bVar2 = propagate(mndx_00,'\x01',ghostly);
      if (bVar2 == '\0') {
        shkp->mhpmax = -100;
      }
    }
    if (shkp->minvent != (obj *)0x0) {
      poVar3 = restobjchn(mf,lev,ghostly,'\0');
      shkp->minvent = poVar3;
      for (_mndx = shkp->minvent; _mndx != (obj *)0x0; _mndx = _mndx->nobj) {
        (_mndx->v).v_ocarry = shkp;
      }
    }
    if (shkp->mw != (obj *)0x0) {
      for (_mndx = shkp->minvent; (_mndx != (obj *)0x0 && ((_mndx->owornmask & 0x100U) == 0));
          _mndx = _mndx->nobj) {
      }
      if (_mndx == (obj *)0x0) {
        shkp->mw = (obj *)0x0;
        impossible("bad monster weapon restore");
      }
      else {
        shkp->mw = _mndx;
      }
    }
    if ((*(uint *)&shkp->field_0x60 >> 0x19 & 1) != 0) {
      restshk(shkp,ghostly);
    }
    nid = uVar4;
    first = shkp;
    if ((*(uint *)&shkp->field_0x60 >> 0x1c & 1) != 0) {
      restpriest(shkp,ghostly);
    }
  }
  if ((obj != (obj *)0x0) && (first->nmon != (monst *)0x0)) {
    impossible("Restmonchn: error reading monchn.");
    first->nmon = (monst *)0x0;
  }
  return (monst *)obj;
}

Assistant:

static struct monst *restmonchn(struct memfile *mf, struct level *lev, boolean ghostly)
{
	struct monst *mtmp, *mtmp2 = NULL;
	struct monst *first = NULL;
	struct obj *obj;
	unsigned int count, mndx;

	/* get the original base address */
	mfmagic_check(mf, MONCHAIN_MAGIC);
	count = mread32(mf);

	while (count--) {
	    mtmp = restore_mon(mf);
	    if (!first)
		first = mtmp;
	    else
		mtmp2->nmon = mtmp;
	    mtmp->dlevel = lev;
	    
	    if (ghostly) {
		unsigned nid = flags.ident++;
		add_id_mapping(mtmp->m_id, nid);
		mtmp->m_id = nid;

		mndx = monsndx(mtmp->data);
		if (propagate(mndx, TRUE, ghostly) == 0) {
		    /* cookie to trigger purge in getbones() */
		    mtmp->mhpmax = DEFUNCT_MONSTER;	
		}
	    }
	    
	    if (mtmp->minvent) {
		mtmp->minvent = restobjchn(mf, lev, ghostly, FALSE);
		/* restore monster back pointer */
		for (obj = mtmp->minvent; obj; obj = obj->nobj)
		    obj->ocarry = mtmp;
	    }
	    
	    if (mtmp->mw) {
		for (obj = mtmp->minvent; obj; obj = obj->nobj)
		    if (obj->owornmask & W_WEP) break;
		if (obj) mtmp->mw = obj;
		else {
		    MON_NOWEP(mtmp);
		    impossible("bad monster weapon restore");
		}
	    }

	    if (mtmp->isshk) restshk(mtmp, ghostly);
	    if (mtmp->ispriest) restpriest(mtmp, ghostly);

	    mtmp2 = mtmp;
	}
	if (first && mtmp2->nmon){
	    impossible("Restmonchn: error reading monchn.");
	    mtmp2->nmon = 0;
	}
	
	return first;
}